

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytedata_p.h
# Opt level: O1

ssize_t __thiscall QByteDataBuffer::read(QByteDataBuffer *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  QArrayData *pQVar2;
  iterator iVar3;
  void *pvVar4;
  void *pvVar5;
  undefined4 in_register_00000034;
  char *pcVar6;
  size_t __n;
  void *__dest;
  
  __dest = (void *)CONCAT44(in_register_00000034,__fd);
  pvVar5 = (void *)this->bufferCompleteSize;
  pvVar4 = __buf;
  if ((long)pvVar5 < (long)__buf) {
    __buf = pvVar5;
    pvVar4 = pvVar5;
  }
  while (0 < (long)__buf) {
    iVar3 = QList<QByteArray>::begin(&this->buffers);
    lVar1 = this->firstPos;
    __n = ((iVar3.i)->d).size - lVar1;
    pvVar5 = (void *)((long)__buf - __n);
    if ((long)__buf < (long)__n) {
      this->bufferCompleteSize = this->bufferCompleteSize - (long)__buf;
      pcVar6 = ((iVar3.i)->d).ptr;
      if (pcVar6 == (char *)0x0) {
        pcVar6 = (char *)&QByteArray::_empty;
      }
      memcpy(__dest,pcVar6 + lVar1,(size_t)__buf);
      this->firstPos = this->firstPos + (long)__buf;
      __buf = (void *)0x0;
    }
    else {
      this->bufferCompleteSize = this->bufferCompleteSize - __n;
      pcVar6 = ((iVar3.i)->d).ptr;
      if (pcVar6 == (char *)0x0) {
        pcVar6 = (char *)&QByteArray::_empty;
      }
      memcpy(__dest,pcVar6 + lVar1,__n);
      __dest = (void *)((long)__dest + __n);
      this->firstPos = 0;
      iVar3 = QList<QByteArray>::begin(&this->buffers);
      pQVar2 = &(((iVar3.i)->d).d)->super_QArrayData;
      ((iVar3.i)->d).size = 0;
      ((iVar3.i)->d).d = (Data *)0x0;
      ((iVar3.i)->d).ptr = (char *)0x0;
      QtPrivate::QGenericArrayOps<QByteArray>::eraseFirst((QGenericArrayOps<QByteArray> *)this);
      __buf = pvVar5;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,1,0x10);
        }
      }
    }
  }
  return (ssize_t)pvVar4;
}

Assistant:

inline qint64 byteAmount() const
    {
        return bufferCompleteSize;
    }